

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int flatcc_emitter_recycle_page(flatcc_emitter_t *E,flatcc_emitter_page_t *p)

{
  flatcc_emitter_page_t *pfVar1;
  flatcc_emitter_page_t *pfVar2;
  flatcc_emitter_page_t *pfVar3;
  int iVar4;
  
  pfVar1 = E->front;
  iVar4 = -1;
  if ((pfVar1 != p) && (E->back != p)) {
    pfVar2 = p->next;
    pfVar3 = p->prev;
    pfVar2->prev = pfVar3;
    pfVar3->next = pfVar2;
    pfVar2 = pfVar1->prev;
    p->prev = pfVar2;
    p->next = pfVar1;
    pfVar2->next = p;
    p->next->prev = p;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int flatcc_emitter_recycle_page(flatcc_emitter_t *E, flatcc_emitter_page_t *p)
{
    if (p == E->front || p == E->back) {
        return -1;
    }
    p->next->prev = p->prev;
    p->prev->next = p->next;
    p->prev = E->front->prev;
    p->next = E->front;
    p->prev->next = p;
    p->next->prev = p;
    return 0;
}